

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<double>::Fad<FadBinaryMul<FadCst<double>,Fad<double>>>
          (Fad<double> *this,FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *fadexpr)

{
  uint uVar1;
  Fad<double> *pFVar2;
  ulong uVar3;
  ulong uVar4;
  value_type vVar5;
  
  pFVar2 = (fadexpr->fadexpr_).right_;
  this->val_ = (fadexpr->fadexpr_).left_.constant_ * pFVar2->val_;
  Vector<double>::Vector(&this->dx_,(pFVar2->dx_).num_elts);
  this->defaultVal = 0.0;
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if (uVar1 != 0) {
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      vVar5 = FadBinaryMul<FadCst<double>,_Fad<double>_>::dx(&fadexpr->fadexpr_,(int)uVar3);
      (this->dx_).ptr_to_data[uVar3] = vVar5;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }